

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

bool __thiscall net_uv::KCPSocket::bind6(KCPSocket *this,char *ip,uint32_t port)

{
  int iVar1;
  uv_udp_t *puVar2;
  undefined1 local_78 [4];
  int32_t r;
  sockaddr_in6 bind_addr;
  allocator<char> local_49;
  string local_48;
  uint32_t local_24;
  char *pcStack_20;
  uint32_t port_local;
  char *ip_local;
  KCPSocket *this_local;
  
  if (this->m_udp == (uv_udp_t *)0x0) {
    local_24 = port;
    pcStack_20 = ip;
    ip_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,ip,&local_49);
    Socket::setIp(&this->super_Socket,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    Socket::setPort(&this->super_Socket,local_24);
    Socket::setIsIPV6(&this->super_Socket,true);
    this->m_soType = SVR_SO;
    iVar1 = uv_ip6_addr(pcStack_20,local_24,(sockaddr_in6 *)local_78);
    if (iVar1 == 0) {
      puVar2 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar2;
      uv_udp_init((this->super_Socket).m_loop,this->m_udp);
      this->m_udp->data = this;
      iVar1 = uv_udp_bind(this->m_udp,(sockaddr *)local_78,4);
      this_local._7_1_ = iVar1 == 0;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool KCPSocket::bind6(const char* ip, uint32_t port)
{
	if (m_udp != NULL)
	{
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setIsIPV6(true);
	this->m_soType = KCPSOType::SVR_SO;

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);

	if (r != 0)
	{
		return false;
	}

	m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
	r = uv_udp_init(m_loop, m_udp);
	CHECK_UV_ASSERT(r);
	m_udp->data = this;

	r = uv_udp_bind(m_udp, (const struct sockaddr*) &bind_addr, UV_UDP_REUSEADDR);

	return (r == 0);
}